

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile)

{
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *this_00;
  bool bVar1;
  cmake *pcVar2;
  string *psVar3;
  type pcVar4;
  ostream *poVar5;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  string sourceFileName;
  string local_b0;
  string local_90;
  undefined1 local_60 [8];
  string buildFilePath;
  string buildFileDir;
  string *sourceFile_local;
  string *commandLine_local;
  cmGlobalNinjaGenerator *this_local;
  
  pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
  std::__cxx11::string::string((string *)(buildFilePath.field_2._M_local_buf + 8),(string *)psVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->CompileCommandsStream);
  if (bVar1) {
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CompileCommandsStream);
    poVar5 = std::operator<<((ostream *)pcVar4,",");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&buildFilePath.field_2 + 8),"/compile_commands.json");
    if ((this->ComputingUnknownDependencies & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"compile_commands.json",
                 (allocator<char> *)&stack0xffffffffffffff4f);
      NinjaOutputPath(&local_90,this,&local_b0);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->CombinedBuildOutputs,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
    }
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&sourceFileName.field_2 + 8));
    this_00 = (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
              ((long)&sourceFileName.field_2 + 8);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
              (&this->CompileCommandsStream,this_00);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              (this_00);
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CompileCommandsStream);
    std::operator<<((ostream *)pcVar4,"[");
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::string((string *)local_f0,(string *)sourceFile);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_f0);
  if (!bVar1) {
    pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
    cmsys::SystemTools::CollapseFullPath(&local_110,(string *)local_f0,psVar3);
    std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->CompileCommandsStream);
  poVar5 = std::operator<<((ostream *)pcVar4,"\n{\n");
  poVar5 = std::operator<<(poVar5,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_130,(string *)((long)&buildFilePath.field_2 + 8));
  poVar5 = std::operator<<(poVar5,(string *)&local_130);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_150,commandLine);
  poVar5 = std::operator<<(poVar5,(string *)&local_150);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_170,(string *)local_f0);
  poVar5 = std::operator<<(poVar5,(string *)&local_170);
  poVar5 = std::operator<<(poVar5,"\"\n");
  std::operator<<(poVar5,"}");
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(buildFilePath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath = buildFileDir + "/compile_commands.json";
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      cm::make_unique<cmGeneratedFileStream>(buildFilePath);
    *this->CompileCommandsStream << "[";
  } else {
    *this->CompileCommandsStream << "," << std::endl;
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "\n{\n"
     << R"(  "directory": ")"
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << R"(  "command": ")"
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << R"(  "file": ")"
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\"\n"
     << "}";
  /* clang-format on */
}